

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int UnixVfs_Realpath(char *zPath,jx9_context *pCtx)

{
  char *zString;
  int iVar1;
  
  iVar1 = 0;
  zString = realpath(zPath,(char *)0x0);
  if (zString == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    jx9_result_string(pCtx,zString,-1);
    free(zString);
  }
  return iVar1;
}

Assistant:

static int UnixVfs_Realpath(const char *zPath, jx9_context *pCtx)
{
#ifndef JX9_UNIX_OLD_LIBC
	char *zReal;
	zReal = realpath(zPath, 0);
	if( zReal == 0 ){
	  return -1;
	}
	jx9_result_string(pCtx, zReal, -1/*Compute length automatically*/);
        /* Release the allocated buffer */
	free(zReal);
	return JX9_OK;
#else
    zPath = 0; /* cc warning */
    pCtx = 0;
    return -1;
#endif
}